

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<char>_>::
int_writer<unsigned_int,_duckdb_fmt::v6::basic_format_specs<char>_>::on_num
          (int_writer<unsigned_int,_duckdb_fmt::v6::basic_format_specs<char>_> *this)

{
  char cVar1;
  char cVar2;
  uint uVar3;
  num_writer f;
  int iVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  int num_digits;
  long lVar8;
  string_view prefix;
  string groups;
  undefined7 uStack_5f;
  undefined1 *local_40;
  long local_38;
  undefined1 local_30 [16];
  
  duckdb_fmt::v6::internal::grouping_impl<char>((locale_ref)&local_40);
  if (local_38 == 0) {
    on_dec(this);
  }
  else {
    cVar1 = this->specs->thousands;
    if (cVar1 == '\0') {
      on_dec(this);
    }
    else {
      uVar3 = this->abs_value;
      uVar6 = 0x1f;
      if ((uVar3 | 1) != 0) {
        for (; (uVar3 | 1) >> uVar6 == 0; uVar6 = uVar6 - 1) {
        }
      }
      uVar6 = (uVar6 ^ 0xffffffe0) * 0x4d1 + 0x9ef1 >> 0xc;
      iVar7 = (uVar6 + 1) -
              (uint)(uVar3 < *(uint *)((long)&basic_data<void>::zero_or_powers_of_10_32 +
                                      (ulong)uVar6 * 4));
      num_digits = (int)local_38 + iVar7;
      lVar8 = 0;
      iVar4 = iVar7;
      do {
        cVar2 = local_40[lVar8];
        iVar5 = iVar4 - cVar2;
        if ((iVar5 == 0 || iVar4 < cVar2) || ((byte)(cVar2 + 0x81U) < 0x82)) {
          num_digits = iVar7 + (int)lVar8;
          iVar5 = iVar4;
          if (local_38 != lVar8) goto LAB_0074fbbf;
          break;
        }
        lVar8 = lVar8 + 1;
        iVar4 = iVar5;
      } while (local_38 != lVar8);
      num_digits = (iVar5 + -1) / (int)(char)local_40[local_38 + -1] + num_digits;
LAB_0074fbbf:
      f._17_7_ = uStack_5f;
      f.sep = cVar1;
      f.size = num_digits;
      f.abs_value = uVar3;
      f.groups = (string *)&local_40;
      prefix.size_._0_4_ = this->prefix_size;
      prefix.data_ = this->prefix;
      prefix.size_._4_4_ = 0;
      basic_writer<duckdb_fmt::v6::buffer_range<char>>::
      write_int<duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<char>>::int_writer<unsigned_int,duckdb_fmt::v6::basic_format_specs<char>>::num_writer>
                ((basic_writer<duckdb_fmt::v6::buffer_range<char>> *)this->writer,num_digits,prefix,
                 *this->specs,f);
    }
  }
  if (local_40 != local_30) {
    operator_delete(local_40);
  }
  return;
}

Assistant:

void on_num() {
      std::string groups = grouping<char_type>(writer.locale_);
      if (groups.empty()) return on_dec();
      auto sep = specs.thousands;
      if (!sep) return on_dec();
      int num_digits = count_digits(abs_value);
      int size = num_digits;
      std::string::const_iterator group = groups.cbegin();
      while (group != groups.cend() && num_digits > *group && *group > 0 &&
             *group != max_value<char>()) {
        size += sep_size;
        num_digits -= *group;
        ++group;
      }
      if (group == groups.cend())
        size += sep_size * ((num_digits - 1) / groups.back());
      writer.write_int(size, get_prefix(), specs,
                       num_writer{abs_value, size, groups, static_cast<char_type>(sep)});
    }